

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O2

int send_disposition(LINK_INSTANCE *link_instance,delivery_number delivery_number,
                    AMQP_VALUE delivery_state)

{
  int iVar1;
  DISPOSITION_HANDLE disposition;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  
  disposition = disposition_create(link_instance->role,delivery_number);
  if (disposition == (DISPOSITION_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0xaa;
    }
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c",
              "send_disposition",0xa9,1,"NULL disposition performative");
    return 0xaa;
  }
  iVar1 = disposition_set_last(disposition,delivery_number);
  if (iVar1 == 0) {
    iVar1 = disposition_set_settled(disposition,true);
    if (iVar1 == 0) {
      iVar1 = disposition_set_state(disposition,delivery_state);
      if (iVar1 == 0) {
        iVar1 = session_send_disposition(link_instance->link_endpoint,disposition);
        if (iVar1 == 0) {
          iVar1 = 0;
          goto LAB_00113a22;
        }
        p_Var2 = xlogging_get_log_function();
        iVar1 = 0xc2;
        if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00113a22;
        pcVar4 = "Sending disposition failed in session send";
        iVar3 = 0xc1;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        iVar1 = 0xbb;
        if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00113a22;
        pcVar4 = "Failed setting state on disposition performative";
        iVar3 = 0xba;
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      iVar1 = 0xb6;
      if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00113a22;
      pcVar4 = "Failed setting settled on disposition performative";
      iVar3 = 0xb5;
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0xb1;
    if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_00113a22;
    pcVar4 = "Failed setting last on disposition performative";
    iVar3 = 0xb0;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c",
            "send_disposition",iVar3,1,pcVar4);
LAB_00113a22:
  disposition_destroy(disposition);
  return iVar1;
}

Assistant:

static int send_disposition(LINK_INSTANCE* link_instance, delivery_number delivery_number, AMQP_VALUE delivery_state)
{
    int result;

    DISPOSITION_HANDLE disposition = disposition_create(link_instance->role, delivery_number);
    if (disposition == NULL)
    {
        LogError("NULL disposition performative");
        result = MU_FAILURE;
    }
    else
    {
        if (disposition_set_last(disposition, delivery_number) != 0)
        {
            LogError("Failed setting last on disposition performative");
            result = MU_FAILURE;
        }
        else if (disposition_set_settled(disposition, true) != 0)
        {
            LogError("Failed setting settled on disposition performative");
            result = MU_FAILURE;
        }
        else if ((delivery_state != NULL) && (disposition_set_state(disposition, delivery_state) != 0))
        {
            LogError("Failed setting state on disposition performative");
            result = MU_FAILURE;
        }
        else
        {
            if (session_send_disposition(link_instance->link_endpoint, disposition) != 0)
            {
                LogError("Sending disposition failed in session send");
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }
        }

        disposition_destroy(disposition);
    }

    return result;
}